

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer.cpp
# Opt level: O2

string * __thiscall
big_integer::to_string_abi_cxx11_(string *__return_storage_ptr__,big_integer *this)

{
  pointer puVar1;
  pointer puVar2;
  pointer pcVar3;
  uint32_t __val;
  big_integer BI;
  string local_40;
  
  puVar1 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar2 = (this->digits).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((puVar1 == puVar2) || (((long)puVar2 - (long)puVar1 == 4 && (*puVar1 == 0)))) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"0",(allocator<char> *)&BI);
  }
  else {
    big_integer(&BI,this);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    while (((long)BI.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)BI.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start != 4 ||
           (*BI.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start != 0))) {
      __val = div_long_short(&BI,10);
      std::__cxx11::to_string(&local_40,__val);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_40);
    }
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    pcVar3 = (__return_storage_ptr__->_M_dataplus)._M_p;
    std::__reverse<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
              (pcVar3,pcVar3 + __return_storage_ptr__->_M_string_length);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&BI);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string big_integer::to_string() const {
    if (digits.empty() || (digits.size() == 1 && digits[0] == 0)) {
        return "0";
    } else {
        big_integer BI(*this);
        std::string outStr;

        while (!(BI.digits.size() == 1 && BI.digits[0] == 0)) {
            outStr += std::to_string(BI.div_long_short(10));
        }
        outStr += (BI.sign == 1 ? "" : "-");
        std::reverse(outStr.begin(), outStr.end());
        return outStr;
    }
}